

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_internal_V2_annotation.cpp
# Opt level: O1

bool __thiscall
ON_OBSOLETE_V5_Annotation::GetTextXform
          (ON_OBSOLETE_V5_Annotation *this,ON_OBSOLETE_V5_RECT gdi_text_rect,int gdi_height_of_I,
          double dimstyle_textheight,double dimstyle_textgap,
          V5_TextDisplayMode dimstyle_textalignment,double dimscale,ON_3dVector cameraX,
          ON_3dVector cameraY,ON_Xform *model_xform,ON_Xform *xform)

{
  ON_3dVector *pOVar1;
  ON_3dVector *Y0;
  V5_eAnnotationType VVar2;
  bool bVar3;
  double dVar4;
  double dVar5;
  bool bVar6;
  long lVar7;
  uint uVar8;
  ON_2dPoint *pOVar9;
  ON_Xform *pOVar10;
  ON_Xform *pOVar11;
  int iVar12;
  byte bVar13;
  ulong uVar14;
  undefined4 uVar15;
  undefined4 uVar16;
  undefined4 extraout_XMM0_Dc;
  undefined4 extraout_XMM0_Dd;
  double dVar17;
  double dVar18;
  ON_2dVector OVar19;
  ON_2dPoint OVar20;
  ON_2dVector local_6e8;
  ON_2dVector local_6d8;
  undefined1 local_6c8 [16];
  double local_6b0;
  ON_2dVector text_offset_translation;
  double local_698;
  ON_3dVector cameraZ;
  ON_Xform horizonal_xform;
  ON_Xform xfs;
  ON_2dVector R_2;
  ON_Xform text_centering_xform;
  ON_Xform plane_translation;
  ON_Xform local_438;
  ON_2dVector R_1;
  double local_3a8;
  ON_Xform gdi_to_world;
  ON_Xform plane_to_world;
  ON_2dPoint E;
  ON_2dPoint E_1;
  ON_Xform local_130;
  ON_Xform mxi;
  
  local_6b0 = gdi_text_rect._0_8_;
  bVar13 = 0;
  local_6c8._8_8_ = local_6c8._0_8_;
  local_6c8._0_8_ = gdi_text_rect._8_8_;
  ON_Xform::ON_Xform(&mxi);
  if (model_xform != (ON_Xform *)0x0) {
    ON_Xform::Inverse(&local_438,model_xform,(double *)0x0);
    pOVar10 = &local_438;
    pOVar11 = &mxi;
    for (lVar7 = 0x10; lVar7 != 0; lVar7 = lVar7 + -1) {
      pOVar11->m_xform[0][0] = pOVar10->m_xform[0][0];
      pOVar10 = (ON_Xform *)((long)pOVar10 + ((ulong)bVar13 * -2 + 1) * 8);
      pOVar11 = (ON_Xform *)((long)pOVar11 + ((ulong)bVar13 * -2 + 1) * 8);
    }
    ON_3dVector::Transform(&cameraX,&mxi);
    ON_3dVector::Transform(&cameraY,&mxi);
  }
  VVar2 = this->m_type;
  iVar12 = 0xa5;
  if (gdi_height_of_I != 0) {
    iVar12 = gdi_height_of_I;
  }
  dVar17 = (double)(~-(ulong)(dimscale == 0.0) & (ulong)dimscale |
                   (ulong)((uint)(-(ulong)(dimscale == 0.0) >> 0x20) & 0x3ff00000) << 0x20);
  if (VVar2 == dtTextBlock) {
    dimstyle_textheight = this->m_textheight;
  }
  dVar18 = dimstyle_textheight * dVar17;
  uVar14 = -(ulong)(dVar18 == 0.0);
  local_698 = (double)(uVar14 & 0x3ff0000000000000 | ~uVar14 & (ulong)dVar18);
  ON_CrossProduct(&cameraZ,&cameraX,&cameraY);
  dVar18 = ON_3dVector::Length(&cameraZ);
  if (1.490116119385e-08 < ABS(1.0 - dVar18)) {
    ON_3dVector::Unitize(&cameraZ);
  }
  dVar18 = local_698 / (double)iVar12;
  pOVar10 = &ON_Xform::IdentityTransformation;
  pOVar11 = &local_438;
  for (lVar7 = 0x10; lVar7 != 0; lVar7 = lVar7 + -1) {
    pOVar11->m_xform[0][0] = pOVar10->m_xform[0][0];
    pOVar10 = (ON_Xform *)((long)pOVar10 + ((ulong)bVar13 * -2 + 1) * 8);
    pOVar11 = (ON_Xform *)((long)pOVar11 + ((ulong)bVar13 * -2 + 1) * 8);
  }
  local_438.m_xform[1][1] = -dVar18;
  local_438.m_xform[0][0] = dVar18;
  if (VVar2 == dtTextBlock) {
    pOVar10 = &ON_Xform::IdentityTransformation;
    pOVar11 = &xfs;
    for (lVar7 = 0x10; lVar7 != 0; lVar7 = lVar7 + -1) {
      pOVar11->m_xform[0][0] = pOVar10->m_xform[0][0];
      pOVar10 = (ON_Xform *)((long)pOVar10 + ((ulong)bVar13 * -2 + 1) * 8);
      pOVar11 = (ON_Xform *)((long)pOVar11 + ((ulong)bVar13 * -2 + 1) * 8);
    }
    ON_Xform::Rotation(&xfs,&ON_xy_plane,&this->m_plane);
    ON_Xform::operator*(&text_centering_xform,&xfs,&local_438);
    lVar7 = 0x10;
    pOVar10 = &text_centering_xform;
    goto LAB_004b2aef;
  }
  bVar6 = false;
  uVar8 = (uint)VVar2;
  if (uVar8 < 9) {
    if ((0xeU >> (uVar8 & 0x1f) & 1) == 0) {
      if ((0x130U >> (uVar8 & 0x1f) & 1) == 0) {
        bVar3 = false;
        bVar6 = false;
        if (uVar8 == 6) {
          bVar6 = dimstyle_textalignment == kHorizontalToScreen;
          bVar3 = !bVar6;
        }
      }
      else {
        bVar3 = true;
        bVar6 = false;
      }
    }
    else {
      bVar6 = true;
      bVar3 = false;
    }
  }
  else {
    bVar3 = false;
  }
  dVar18 = dVar18 * (double)(local_6c8._0_4_ - local_6b0._0_4_);
  if (!(bool)(dimstyle_textalignment == kHorizontalToScreen & (bVar6 ^ 1U))) {
    local_438.m_xform[0][3] =
         *(double *)(&DAT_006cb380 + (ulong)((this->m_justification & 4) == 0) * 8) * dVar18;
  }
  dVar17 = dVar17 * dimstyle_textgap;
  local_438.m_xform[1][3] = local_698 * -0.5;
  if (dimstyle_textalignment == kHorizontalToScreen) {
    ON_2dVector::ON_2dVector(&local_6d8,1.0,0.0);
    ON_2dVector::ON_2dVector(&local_6e8,0.0,0.0);
    pOVar10 = &ON_Xform::IdentityTransformation;
    pOVar11 = &xfs;
    for (lVar7 = 0x10; lVar7 != 0; lVar7 = lVar7 + -1) {
      pOVar11->m_xform[0][0] = pOVar10->m_xform[0][0];
      pOVar10 = (ON_Xform *)((long)pOVar10 + ((ulong)bVar13 * -2 + 1) * 8);
      pOVar11 = (ON_Xform *)((long)pOVar11 + ((ulong)bVar13 * -2 + 1) * 8);
    }
    if (VVar2 == dtLeader) {
      if ((this->m_justification & 4) == 0) {
        if ((this->m_justification & 1) == 0) goto LAB_004b26b0;
        dVar4 = dVar18 * 0.5 + dVar17;
      }
      else {
        dVar4 = -(dVar18 * 0.5 + dVar17);
      }
      ON_2dVector::Set(&local_6e8,dVar4,0.0);
    }
  }
  else {
    dVar4 = ON_3dVector::operator*(&cameraZ,&(this->m_plane).zaxis);
    if (dVar4 < -1.490116119385e-08) {
      pOVar10 = &ON_Xform::IdentityTransformation;
      pOVar11 = &xfs;
      for (lVar7 = 0x10; lVar7 != 0; lVar7 = lVar7 + -1) {
        pOVar11->m_xform[0][0] = pOVar10->m_xform[0][0];
        pOVar10 = (ON_Xform *)((long)pOVar10 + ((ulong)bVar13 * -2 + 1) * 8);
        pOVar11 = (ON_Xform *)((long)pOVar11 + ((ulong)bVar13 * -2 + 1) * 8);
      }
      if (bVar6) {
        xfs.m_xform[0][0] = -1.0;
        xfs.m_xform[0][3] = (double)(local_6c8._0_4_ + local_6b0._0_4_);
      }
      ON_Xform::operator*(&text_centering_xform,&local_438,&xfs);
      pOVar10 = &text_centering_xform;
      pOVar11 = &local_438;
      for (lVar7 = 0x10; lVar7 != 0; lVar7 = lVar7 + -1) {
        pOVar11->m_xform[0][0] = pOVar10->m_xform[0][0];
        pOVar10 = (ON_Xform *)((long)pOVar10 + ((ulong)bVar13 * -2 + 1) * 8);
        pOVar11 = (ON_Xform *)((long)pOVar11 + ((ulong)bVar13 * -2 + 1) * 8);
      }
    }
    ON_2dVector::ON_2dVector(&local_6d8,1.0,0.0);
    ON_2dVector::ON_2dVector(&local_6e8,0.0,0.0);
    pOVar10 = &ON_Xform::IdentityTransformation;
    pOVar11 = &xfs;
    for (lVar7 = 0x10; lVar7 != 0; lVar7 = lVar7 + -1) {
      pOVar11->m_xform[0][0] = pOVar10->m_xform[0][0];
      pOVar10 = (ON_Xform *)((long)pOVar10 + ((ulong)bVar13 * -2 + 1) * 8);
      pOVar11 = (ON_Xform *)((long)pOVar11 + ((ulong)bVar13 * -2 + 1) * 8);
    }
    if ((byte)(VVar2 - dtDimLinear) < 2) {
      if (dimstyle_textalignment == kAboveLine) {
        local_6e8.y = local_698 * 0.5 + dVar17;
      }
      pOVar1 = &(this->m_plane).yaxis;
      dVar4 = ON_3dVector::operator*(pOVar1,&cameraY);
      ON_3dVector::operator-((ON_3dVector *)&text_centering_xform,pOVar1);
      dVar5 = ON_3dVector::operator*((ON_3dVector *)&text_centering_xform,&cameraX);
      if ((double)(~-(ulong)(ABS(dVar4) <= 1.490116119385e-08) & (ulong)dVar4 |
                  (~-(ulong)(1.490116119385e-08 < ABS(dVar5)) & (ulong)dVar4 |
                  (ulong)dVar5 & -(ulong)(1.490116119385e-08 < ABS(dVar5))) &
                  -(ulong)(ABS(dVar4) <= 1.490116119385e-08)) < 0.0) {
        OVar19 = ON_2dVector::operator-(&local_6e8);
        local_6e8.y = OVar19.y;
        local_6e8.x = OVar19.x;
        OVar19 = ON_2dVector::operator-(&local_6d8);
        local_6d8.y = OVar19.y;
        local_6d8.x = OVar19.x;
      }
    }
    else if ((VVar2 - 4 < 3) || (VVar2 == dtDimOrdinate)) {
      ON_2dPoint::ON_2dPoint(&E,0.0,0.0);
      ON_2dVector::ON_2dVector(&R_1,1.0,0.0);
      GetLeaderEndAndDirection(this,&E,&R_1);
      local_6d8.x = R_1.x;
      local_6d8.y = R_1.y;
      OVar19 = ::operator*(dVar18 * 0.5 + dVar17,&local_6d8);
      local_6e8.y = OVar19.y;
      local_6e8.x = OVar19.x;
      text_centering_xform.m_xform[0][2] = (this->m_plane).origin.z;
      text_centering_xform.m_xform[0][0] = (this->m_plane).origin.x;
      text_centering_xform.m_xform[0][1] = (this->m_plane).origin.y;
      ON_Plane::PointAt((ON_3dPoint *)&plane_translation,&this->m_plane,R_1.x,R_1.y);
      ON_Plane::PointAt((ON_3dPoint *)&plane_to_world,&this->m_plane,-R_1.y,R_1.x);
      ON_3dPoint::operator-
                ((ON_3dVector *)&horizonal_xform,(ON_3dPoint *)&plane_translation,
                 (ON_3dPoint *)&text_centering_xform);
      ON_3dPoint::operator-
                ((ON_3dVector *)&gdi_to_world,(ON_3dPoint *)&plane_to_world,
                 (ON_3dPoint *)&text_centering_xform);
      dVar4 = ON_3dVector::operator*((ON_3dVector *)&horizonal_xform,&cameraX);
      if (dVar4 <= 2.3283064365386963e-10) {
        xfs.m_xform[0][0] = -1.0;
      }
      dVar4 = ON_3dVector::operator*((ON_3dVector *)&gdi_to_world,&cameraY);
      if (dVar4 <= 2.3283064365386963e-10) {
        xfs.m_xform[1][1] = -1.0;
      }
    }
    else if ((VVar2 == dtDimAngular) &&
            (bVar6 = ON_Object::IsKindOf((ON_Object *)this,
                                         &ON_OBSOLETE_V5_DimAngular::
                                          m_ON_OBSOLETE_V5_DimAngular_class_rtti), bVar6)) {
      dVar4 = (double)this[1].super_ON_Geometry.super_ON_Object._vptr_ON_Object * 0.5;
      local_6c8._0_8_ = dVar4;
      local_6b0 = cos(dVar4);
      dVar4 = sin((double)local_6c8._0_8_);
      ON_2dVector::ON_2dVector((ON_2dVector *)&horizonal_xform,local_6b0,dVar4);
      local_6c8._0_8_ = (double)local_6c8._0_8_ + -1.5707963267948966;
      local_6d8.x = cos((double)local_6c8._0_8_);
      local_6d8.y = sin((double)local_6c8._0_8_);
      ::operator*((ON_3dVector *)&plane_translation,horizonal_xform.m_xform[0][0],
                  &(this->m_plane).xaxis);
      ::operator*((ON_3dVector *)&plane_to_world,horizonal_xform.m_xform[0][1],
                  &(this->m_plane).yaxis);
      ON_3dVector::operator+
                ((ON_3dVector *)&text_centering_xform,(ON_3dVector *)&plane_translation,
                 (ON_3dVector *)&plane_to_world);
      dVar4 = ON_3dVector::operator*((ON_3dVector *)&text_centering_xform,&cameraX);
      local_6c8._8_4_ = extraout_XMM0_Dc;
      local_6c8._0_8_ = dVar4;
      local_6c8._12_4_ = extraout_XMM0_Dd;
      dVar4 = ON_3dVector::operator*((ON_3dVector *)&text_centering_xform,&cameraY);
      if ((double)(~-(ulong)(1.490116119385e-08 < ABS((double)local_6c8._0_8_)) & (ulong)dVar4 |
                  (~-(ulong)(ABS(dVar4) <= 1.490116119385e-08) & (ulong)dVar4 |
                  (ulong)-(double)local_6c8._0_8_ & -(ulong)(ABS(dVar4) <= 1.490116119385e-08)) &
                  -(ulong)(1.490116119385e-08 < ABS((double)local_6c8._0_8_))) < 0.0) {
        OVar19 = ON_2dVector::operator-(&local_6d8);
        local_6d8.y = OVar19.y;
        local_6d8.x = OVar19.x;
      }
      if (dimstyle_textalignment == kAboveLine) {
        local_6e8.y = local_698 * 0.5 + dVar17;
        local_6e8.x = -local_6e8.y * local_6d8.y;
        local_6e8.y = local_6e8.y * local_6d8.x;
      }
    }
  }
LAB_004b26b0:
  pOVar10 = &ON_Xform::IdentityTransformation;
  pOVar11 = &text_centering_xform;
  for (lVar7 = 0x10; lVar7 != 0; lVar7 = lVar7 + -1) {
    pOVar11->m_xform[0][0] = pOVar10->m_xform[0][0];
    pOVar10 = (ON_Xform *)((long)pOVar10 + ((ulong)bVar13 * -2 + 1) * 8);
    pOVar11 = (ON_Xform *)((long)pOVar11 + ((ulong)bVar13 * -2 + 1) * 8);
  }
  text_centering_xform.m_xform[0][0] = local_6d8.x;
  text_centering_xform.m_xform[0][1] = -local_6d8.y;
  text_centering_xform.m_xform[1][0] = local_6d8.y;
  text_centering_xform.m_xform[1][1] = local_6d8.x;
  ON_Xform::operator*(&plane_translation,&text_centering_xform,&xfs);
  pOVar10 = &plane_translation;
  pOVar11 = &text_centering_xform;
  for (lVar7 = 0x10; lVar7 != 0; lVar7 = lVar7 + -1) {
    pOVar11->m_xform[0][0] = pOVar10->m_xform[0][0];
    pOVar10 = (ON_Xform *)((long)pOVar10 + ((ulong)bVar13 * -2 + 1) * 8);
    pOVar11 = (ON_Xform *)((long)pOVar11 + ((ulong)bVar13 * -2 + 1) * 8);
  }
  text_centering_xform.m_xform[0][3] = local_6e8.x;
  text_centering_xform.m_xform[1][3] = local_6e8.y;
  ON_2dVector::ON_2dVector(&text_offset_translation,0.0,0.0);
  switch(VVar2) {
  case dtDimLinear:
  case dtDimAligned:
    if ((4 < (this->m_points).super_ON_SimpleArray<ON_2dPoint>.m_count) &&
       (bVar6 = ON_Object::IsKindOf((ON_Object *)this,
                                    &ON_OBSOLETE_V5_DimLinear::m_ON_OBSOLETE_V5_DimLinear_class_rtti
                                   ), bVar6)) {
      OVar20 = ON_OBSOLETE_V5_DimLinear::Dim2dPoint((ON_OBSOLETE_V5_DimLinear *)this,10000);
      plane_translation.m_xform[0][1] = OVar20.y;
      uVar15 = OVar20.x._0_4_;
      uVar16 = OVar20.x._4_4_;
LAB_004b2810:
      pOVar9 = (ON_2dPoint *)&plane_translation;
      plane_translation.m_xform[0][0] = (double)CONCAT44(uVar16,uVar15);
LAB_004b2821:
      ON_2dVector::operator=(&text_offset_translation,pOVar9);
    }
    break;
  case dtDimAngular:
    if ((3 < (this->m_points).super_ON_SimpleArray<ON_2dPoint>.m_count) &&
       (bVar6 = ON_Object::IsKindOf((ON_Object *)this,
                                    &ON_OBSOLETE_V5_DimAngular::
                                     m_ON_OBSOLETE_V5_DimAngular_class_rtti), bVar6)) {
      OVar20 = ON_OBSOLETE_V5_DimAngular::Dim2dPoint((ON_OBSOLETE_V5_DimAngular *)this,10000);
      plane_translation.m_xform[0][1] = OVar20.y;
      uVar15 = OVar20.x._0_4_;
      uVar16 = OVar20.x._4_4_;
      goto LAB_004b2810;
    }
    break;
  case dtDimDiameter:
  case dtDimRadius:
    if (3 < (this->m_points).super_ON_SimpleArray<ON_2dPoint>.m_count) {
      pOVar9 = (this->m_points).super_ON_SimpleArray<ON_2dPoint>.m_a + 2;
      goto LAB_004b2821;
    }
    break;
  case dtLeader:
    lVar7 = (long)(this->m_points).super_ON_SimpleArray<ON_2dPoint>.m_count;
    if (0 < lVar7) {
      pOVar9 = (this->m_points).super_ON_SimpleArray<ON_2dPoint>.m_a + lVar7 + -1;
      goto LAB_004b2821;
    }
    break;
  case dtDimOrdinate:
    if ((this->m_points).super_ON_SimpleArray<ON_2dPoint>.m_count == 2) {
      pOVar9 = (this->m_points).super_ON_SimpleArray<ON_2dPoint>.m_a + 1;
      goto LAB_004b2821;
    }
  }
  pOVar10 = &ON_Xform::IdentityTransformation;
  pOVar11 = &plane_translation;
  for (lVar7 = 0x10; lVar7 != 0; lVar7 = lVar7 + -1) {
    pOVar11->m_xform[0][0] = pOVar10->m_xform[0][0];
    pOVar10 = (ON_Xform *)((long)pOVar10 + ((ulong)bVar13 * -2 + 1) * 8);
    pOVar11 = (ON_Xform *)((long)pOVar11 + ((ulong)bVar13 * -2 + 1) * 8);
  }
  plane_translation.m_xform[0][3] = text_offset_translation.x;
  plane_translation.m_xform[1][3] = text_offset_translation.y;
  pOVar10 = &ON_Xform::IdentityTransformation;
  pOVar11 = &plane_to_world;
  for (lVar7 = 0x10; lVar7 != 0; lVar7 = lVar7 + -1) {
    pOVar11->m_xform[0][0] = pOVar10->m_xform[0][0];
    pOVar10 = (ON_Xform *)((long)pOVar10 + ((ulong)bVar13 * -2 + 1) * 8);
    pOVar11 = (ON_Xform *)((long)pOVar11 + ((ulong)bVar13 * -2 + 1) * 8);
  }
  ON_Xform::Rotation(&plane_to_world,&ON_xy_plane,&this->m_plane);
  pOVar10 = &ON_Xform::IdentityTransformation;
  pOVar11 = &horizonal_xform;
  for (lVar7 = 0x10; lVar7 != 0; lVar7 = lVar7 + -1) {
    pOVar11->m_xform[0][0] = pOVar10->m_xform[0][0];
    pOVar10 = (ON_Xform *)((long)pOVar10 + ((ulong)bVar13 * -2 + 1) * 8);
    pOVar11 = (ON_Xform *)((long)pOVar11 + ((ulong)bVar13 * -2 + 1) * 8);
  }
  if (dimstyle_textalignment == kHorizontalToScreen) {
    ON_Plane::PointAt((ON_3dPoint *)&gdi_to_world,&this->m_plane,text_offset_translation.x,
                      text_offset_translation.y);
    pOVar1 = &(this->m_plane).xaxis;
    Y0 = &(this->m_plane).yaxis;
    ON_Xform::Rotation(&horizonal_xform,(ON_3dPoint *)&gdi_to_world,pOVar1,Y0,&(this->m_plane).zaxis
                       ,(ON_3dPoint *)&gdi_to_world,&cameraX,&cameraY,&cameraZ);
    if (bVar3) {
      ON_2dPoint::ON_2dPoint(&E_1,0.0,0.0);
      ON_2dVector::ON_2dVector(&R_2,1.0,0.0);
      GetLeaderEndAndDirection(this,&E_1,&R_2);
      ::operator*((ON_3dVector *)&R_1,R_2.x,pOVar1);
      ::operator*((ON_3dVector *)&local_130,R_2.y,Y0);
      ON_3dVector::operator+((ON_3dVector *)&E,(ON_3dVector *)&R_1,(ON_3dVector *)&local_130);
      dVar4 = ON_3dVector::operator*((ON_3dVector *)&E,&cameraX);
      ::operator*((ON_3dVector *)&R_1,
                  (double)(-(ulong)(-1.490116119385e-08 < dVar4) & (ulong)dVar17 |
                          ~-(ulong)(-1.490116119385e-08 < dVar4) & (ulong)-(dVar18 + dVar17)),
                  &cameraX);
      E.x = R_1.x;
      E.y = R_1.y;
      horizonal_xform.m_xform[0][3] = R_1.x + horizonal_xform.m_xform[0][3];
      horizonal_xform.m_xform[1][3] = R_1.y + horizonal_xform.m_xform[1][3];
      horizonal_xform.m_xform[2][3] = local_3a8 + horizonal_xform.m_xform[2][3];
    }
  }
  pOVar10 = &gdi_to_world;
  ON_Xform::ON_Xform(pOVar10);
  ON_Xform::operator*((ON_Xform *)&E_1,&horizonal_xform,&plane_to_world);
  ON_Xform::operator*(&local_130,(ON_Xform *)&E_1,&plane_translation);
  ON_Xform::operator*((ON_Xform *)&R_1,&local_130,&text_centering_xform);
  ON_Xform::operator*((ON_Xform *)&E,(ON_Xform *)&R_1,&local_438);
  pOVar9 = &E;
  pOVar11 = pOVar10;
  for (lVar7 = 0x10; lVar7 != 0; lVar7 = lVar7 + -1) {
    pOVar11->m_xform[0][0] = (*(double (*) [4])&pOVar9->x)[0];
    pOVar9 = (ON_2dPoint *)&pOVar9[-(ulong)bVar13].y;
    pOVar11 = (ON_Xform *)((long)pOVar11 + ((ulong)bVar13 * -2 + 1) * 8);
  }
  lVar7 = 0x10;
LAB_004b2aef:
  for (; lVar7 != 0; lVar7 = lVar7 + -1) {
    xform->m_xform[0][0] = pOVar10->m_xform[0][0];
    pOVar10 = (ON_Xform *)((long)pOVar10 + ((ulong)bVar13 * -2 + 1) * 8);
    xform = (ON_Xform *)((long)xform + ((ulong)bVar13 * -2 + 1) * 8);
  }
  return true;
}

Assistant:

bool ON_OBSOLETE_V5_Annotation::GetTextXform( 
      ON_OBSOLETE_V5_RECT gdi_text_rect,
      int gdi_height_of_I,
      double dimstyle_textheight,
      double dimstyle_textgap,
      ON_INTERNAL_OBSOLETE::V5_TextDisplayMode dimstyle_textalignment,
      double dimscale,
      ON_3dVector cameraX,
      ON_3dVector cameraY,
      const ON_Xform* model_xform,
      ON_Xform& xform
      ) const
{
  ON_Xform mxi;
  if( model_xform)
  {
    mxi = model_xform->Inverse();
    cameraX.Transform( mxi);
    cameraY.Transform( mxi);
  }
  const ON_OBSOLETE_V5_Annotation* ann = this;

  const ON_INTERNAL_OBSOLETE::V5_eAnnotationType ann_type = ann->m_type;

  if ( 0 == gdi_height_of_I )
  {
    // Default to height of Ariel 'I'
    gdi_height_of_I = (165*ON_Font::Constants::AnnotationFontCellHeight)/256;
  }

  if ( 0.0 == dimscale )
  {
    dimscale = 1.0;
  }

  dimstyle_textheight *= dimscale;
  dimstyle_textgap *= dimscale;

  double textheight = ( ON_INTERNAL_OBSOLETE::V5_eAnnotationType::dtTextBlock == ann_type )
                    ? m_textheight*dimscale
                    : dimstyle_textheight;
  if ( 0.0 == textheight )
    textheight = 1.0;

  ON_3dVector cameraZ = ON_CrossProduct( cameraX, cameraY );
  if ( fabs( 1.0 - cameraZ.Length() ) > ON_SQRT_EPSILON )
  {
    cameraZ.Unitize();
  }

  // This xform is a scale from Windows gdi coordinates 
  // to annotation plane coordinates.
  const double gdi_to_plane_scale = textheight/gdi_height_of_I;
  ON_Xform gdi_to_plane(ON_Xform::IdentityTransformation);
  gdi_to_plane.m_xform[0][0] =  gdi_to_plane_scale;
  gdi_to_plane.m_xform[1][1] = -gdi_to_plane_scale;

  // width and height of text line in Rhino units.
  const double text_line_width  = gdi_to_plane_scale*(gdi_text_rect.right - gdi_text_rect.left);
  //const double text_line_height = gdi_to_plane_scale*(gdi_text_rect.bottom - gdi_text_rect.top);

  if ( ON_INTERNAL_OBSOLETE::V5_eAnnotationType::dtTextBlock == ann_type )
  {
    // The orientation of the text is text blocks
    // does not depend on the view or text alignment
    // settings.  The position and orientation of 
    // the text in every other annotation depends on
    // the view and text alignment settings.  
    //
    // It simplifies the code for the rest of the
    // annotation settings to quickly deal with text
    // blocks here.
    ON_Xform plane_to_world(ON_Xform::IdentityTransformation);
    plane_to_world.Rotation(ON_xy_plane,ann->m_plane);
    xform = plane_to_world*gdi_to_plane;
    return true;
  }

  // text_position_mode
  //   1 = linear, aligned, or anglular dimension
  //       (dimension definition determines center point of text box)
  //   2 = radial, diameter, leader
  //       (dimension definition determined end point of text box)
  int position_style = 0;
  switch( ann_type )
  {
  case ON_INTERNAL_OBSOLETE::V5_eAnnotationType::dtDimAligned:
  case ON_INTERNAL_OBSOLETE::V5_eAnnotationType::dtDimLinear:
  case ON_INTERNAL_OBSOLETE::V5_eAnnotationType::dtDimAngular:
    // dimension definition determines center point of text box
    position_style = 1;
    break;

  case ON_INTERNAL_OBSOLETE::V5_eAnnotationType::dtLeader:
    if (ON_INTERNAL_OBSOLETE::V5_TextDisplayMode::kHorizontalToScreen == dimstyle_textalignment)
      position_style = 1;
    else
      position_style = 2;
    break;

  case ON_INTERNAL_OBSOLETE::V5_eAnnotationType::dtDimRadius:
  case ON_INTERNAL_OBSOLETE::V5_eAnnotationType::dtDimDiameter:
  case ON_INTERNAL_OBSOLETE::V5_eAnnotationType::dtDimOrdinate:
    // dimension definition determines end of text box
    position_style = 2;
    break;

  case ON_INTERNAL_OBSOLETE::V5_eAnnotationType::dtTextBlock:
  case ON_INTERNAL_OBSOLETE::V5_eAnnotationType::dtNothing:
    break;
  }

  // This translation puts the center of the fist line of text at
  // (0,0) in the annotation's plane.
  if (ON_INTERNAL_OBSOLETE::V5_TextDisplayMode::kHorizontalToScreen != dimstyle_textalignment || 1 == position_style)
  {
    if((m_justification & tjRight) == tjRight)
      gdi_to_plane.m_xform[0][3] = 0.5*text_line_width;
    else
      gdi_to_plane.m_xform[0][3] = -0.5*text_line_width;
  }
  gdi_to_plane.m_xform[1][3] = -0.5*textheight;

  if (ON_INTERNAL_OBSOLETE::V5_TextDisplayMode::kHorizontalToScreen != dimstyle_textalignment)
  {
    if ( ((cameraZ*m_plane.zaxis) < -ON_SQRT_EPSILON) )
    {
      // Viewing dimension from the backside
      ON_Xform flip(ON_Xform::IdentityTransformation);
      switch ( position_style )
      {
      case 1: // ON_INTERNAL_OBSOLETE::V5_eAnnotationType::dtDimLinear, ON_INTERNAL_OBSOLETE::V5_eAnnotationType::dtDimAligned, ON_INTERNAL_OBSOLETE::V5_eAnnotationType::dtDimAngular
        flip.m_xform[0][0] = -1.0;
        flip.m_xform[0][3] = gdi_text_rect.left + gdi_text_rect.right;
        break;

      case 2: // ON_INTERNAL_OBSOLETE::V5_eAnnotationType::dtDimDiameter, ON_INTERNAL_OBSOLETE::V5_eAnnotationType::dtDimRadius, ON_INTERNAL_OBSOLETE::V5_eAnnotationType::dtLeader
            //flip.m_xform[1][1] = -1.0;
            //flip.m_xform[1][3] = -(gdi_text_rect.top + gdi_text_rect.bottom);
        break;
      }
      gdi_to_plane = gdi_to_plane*flip;
    }
  }

  // text_centering_rotation rotates about the "center".  Angular,
  // radial, and leader dimensions use this rotation.
  ON_2dVector text_centering_rotation(1.0,0.0);

  // text_centering_translation is a small translation deals with
  // text that is above or to the right of the "center" point.  
  // It is no larger than dimstyle_gap + 1/2 the size of the
  // text's bounding box.
  ON_2dVector text_centering_translation(0.0,0.0);
  double x = 1.0, y = 1.0;
  ON_Xform xfs(ON_Xform::IdentityTransformation);

  if (ON_INTERNAL_OBSOLETE::V5_TextDisplayMode::kHorizontalToScreen != dimstyle_textalignment)
  {
    if ( ON_INTERNAL_OBSOLETE::V5_eAnnotationType::dtDimLinear  == ann_type || ON_INTERNAL_OBSOLETE::V5_eAnnotationType::dtDimAligned == ann_type )
    {
      if (ON_INTERNAL_OBSOLETE::V5_TextDisplayMode::kAboveLine == dimstyle_textalignment)
      {
        text_centering_translation.y =  0.5*textheight+dimstyle_textgap;
      }
      y =  ann->m_plane.yaxis*cameraY;
      x = -ann->m_plane.yaxis*cameraX;
      if ( fabs(y) <= ON_SQRT_EPSILON && fabs(x) > ON_SQRT_EPSILON )
      {
        y = x;
      }
      if ( y < 0.0 )
      {
        text_centering_translation = -text_centering_translation;
        text_centering_rotation = -text_centering_rotation; // rotate 180 degrees
      }
    }
    else if ( ON_INTERNAL_OBSOLETE::V5_eAnnotationType::dtDimAngular == ann_type )
    {
      // This transform rotates the text in the annotation plane.
      const ON_OBSOLETE_V5_DimAngular* angular_dim = ON_OBSOLETE_V5_DimAngular::Cast(ann);
      if ( 0 != angular_dim )
      {
        double a = 0.5*angular_dim->m_angle;
        ON_2dVector R(cos(a),sin(a));
        a -= 0.5*ON_PI;
        text_centering_rotation.x = cos(a);
        text_centering_rotation.y = sin(a);
        ON_3dVector V = R.x*m_plane.xaxis + R.y*m_plane.yaxis;
        x = V*cameraX;
        y = V*cameraY;
        if ( fabs(y) <= ON_SQRT_EPSILON && fabs(x) > ON_SQRT_EPSILON )
        {
          y = -x;
        }
        if ( y < 0.0 )
        {
          text_centering_rotation = -text_centering_rotation; // add another 180 degrees of rotation
        }

        if (ON_INTERNAL_OBSOLETE::V5_TextDisplayMode::kAboveLine == dimstyle_textalignment)
        {
          y = 0.5*textheight + dimstyle_textgap;
          text_centering_translation.x = -y*text_centering_rotation.y;
          text_centering_translation.y =  y*text_centering_rotation.x;
        }
      }
    }
    else if (    ON_INTERNAL_OBSOLETE::V5_eAnnotationType::dtDimDiameter == ann_type 
              || ON_INTERNAL_OBSOLETE::V5_eAnnotationType::dtDimRadius == ann_type 
              || ON_INTERNAL_OBSOLETE::V5_eAnnotationType::dtLeader == ann_type 
              || ON_INTERNAL_OBSOLETE::V5_eAnnotationType::dtDimOrdinate == ann_type)
    {
      // 30 Jan, 2015 - redid this again rh-29493, rh-29540
      ON_2dPoint E(0.0,0.0); // end point
      ON_2dVector R(1.0,0.0); // unit vector from penultimate point to end point
      GetLeaderEndAndDirection( this, E, R );
      text_centering_rotation = R;
      text_centering_translation = (dimstyle_textgap + 0.5*text_line_width)*text_centering_rotation;

      ON_3dPoint p0 = m_plane.origin;
      ON_3dPoint prx = m_plane.PointAt(R.x, R.y);
      ON_3dPoint pry = m_plane.PointAt(-R.y, R.x);

      ON_3dVector xr = prx - p0;  // 3d direction of text x
      ON_3dVector yr = pry - p0;  // 3d direction of text y

      if (xr * cameraX <= ON_ZERO_TOLERANCE)     // 22 April 2015 - Lowell - Fixed rh-30239
        xfs.m_xform[0][0] = -1.0;
      if (yr * cameraY <= ON_ZERO_TOLERANCE)
        xfs.m_xform[1][1] = -1.0;
    }
  }
  else if(ann_type == ON_INTERNAL_OBSOLETE::V5_eAnnotationType::dtLeader)
  {
    if((m_justification & tjRight) == tjRight)
      text_centering_translation.Set(-(dimstyle_textgap + 0.5*text_line_width), 0.0);
    else if((m_justification & tjLeft) == tjLeft)
      text_centering_translation.Set(dimstyle_textgap + 0.5*text_line_width, 0.0);
  }

  ON_Xform text_centering_xform(ON_Xform::IdentityTransformation);
  text_centering_xform.m_xform[0][0] =  text_centering_rotation.x;
  text_centering_xform.m_xform[0][1] = -text_centering_rotation.y;
  text_centering_xform.m_xform[1][0] =  text_centering_rotation.y;
  text_centering_xform.m_xform[1][1] =  text_centering_rotation.x; 

  text_centering_xform = text_centering_xform * xfs;

  // Since the translation happens after the rotation about (0,0),
  // we can just tack it on here.
  text_centering_xform.m_xform[0][3] =  text_centering_translation.x;
  text_centering_xform.m_xform[1][3] =  text_centering_translation.y;

  // This transform translates the text in the annotation plane
  // from the plane origin to the final location of the annotation text
  // It can be a large translation
  ON_2dVector text_offset_translation(0.0,0.0); // CRhinoText::Offset() = text->Offset()
  switch( ann_type )
  {
  case ON_INTERNAL_OBSOLETE::V5_eAnnotationType::dtDimLinear:
  case ON_INTERNAL_OBSOLETE::V5_eAnnotationType::dtDimAligned:
    if ( m_points.Count() >= ON_OBSOLETE_V5_DimLinear::dim_pt_count )
    {
      const ON_OBSOLETE_V5_DimLinear* linear_dim = ON_OBSOLETE_V5_DimLinear::Cast(ann);
      if ( linear_dim )
      {
        text_offset_translation = linear_dim->Dim2dPoint(ON_OBSOLETE_V5_DimLinear::text_pivot_pt);
      }
    }
    break;

  case ON_INTERNAL_OBSOLETE::V5_eAnnotationType::dtDimAngular:
    if ( m_points.Count() >= ON_OBSOLETE_V5_DimAngular::dim_pt_count )
    {
      const ON_OBSOLETE_V5_DimAngular* angular_dim = ON_OBSOLETE_V5_DimAngular::Cast(ann);
      if ( angular_dim )
      {
        text_offset_translation = angular_dim->Dim2dPoint(ON_OBSOLETE_V5_DimAngular::text_pivot_pt);
      }
    }
    break;

  case ON_INTERNAL_OBSOLETE::V5_eAnnotationType::dtDimDiameter:
  case ON_INTERNAL_OBSOLETE::V5_eAnnotationType::dtDimRadius:
    if ( m_points.Count() >= ON_OBSOLETE_V5_DimRadial::dim_pt_count )
    {
      // No user positioned text on radial dimensions.
      text_offset_translation = m_points[ON_OBSOLETE_V5_DimRadial::tail_pt_index];
    }
    break;

  case ON_INTERNAL_OBSOLETE::V5_eAnnotationType::dtLeader:
    if ( m_points.Count() > 0 )
    {
      // No user positioned text on leaders.
      text_offset_translation = *m_points.Last();
    }
    break;

  case ON_INTERNAL_OBSOLETE::V5_eAnnotationType::dtDimOrdinate:
    if ( m_points.Count() == 2 )
    {
      // No user positioned text on leaders.
      text_offset_translation = m_points[1];
    }
    break;

  case ON_INTERNAL_OBSOLETE::V5_eAnnotationType::dtTextBlock:
  case ON_INTERNAL_OBSOLETE::V5_eAnnotationType::dtNothing:
    break;
  }

  ON_Xform plane_translation(ON_Xform::IdentityTransformation);
  plane_translation.m_xform[0][3] = text_offset_translation.x;
  plane_translation.m_xform[1][3] = text_offset_translation.y;

  // this transform maps a point in the annotation plane to world coordinates
  ON_Xform plane_to_world(ON_Xform::IdentityTransformation);
  plane_to_world.Rotation(ON_xy_plane,ann->m_plane);

  ON_Xform horizonal_xform(ON_Xform::IdentityTransformation);
  if (ON_INTERNAL_OBSOLETE::V5_TextDisplayMode::kHorizontalToScreen == dimstyle_textalignment)
  {
    ON_3dPoint fixed_point = ann->m_plane.PointAt(text_offset_translation.x,text_offset_translation.y);
    horizonal_xform.Rotation( 
        fixed_point,
        ann->m_plane.xaxis,
        ann->m_plane.yaxis,
        ann->m_plane.zaxis,
        fixed_point,
        cameraX,
        cameraY,
        cameraZ
        );

    if ( 2 == position_style )
    {
      // leaders, radial, and diameter
      ON_2dPoint E(0.0,0.0); // end point
      ON_2dVector R(1.0,0.0); // unit vector from penultimate point to end point
      GetLeaderEndAndDirection( this, E, R );
      ON_3dVector V = R.x*m_plane.xaxis + R.y*m_plane.yaxis;
      x = V*cameraX;
      y = ( x > -ON_SQRT_EPSILON )
        ? dimstyle_textgap
        : -(dimstyle_textgap + text_line_width);
      V = y*cameraX;
      horizonal_xform.m_xform[0][3] += V.x;
      horizonal_xform.m_xform[1][3] += V.y;
      horizonal_xform.m_xform[2][3] += V.z;
    }
  }

  ON_Xform gdi_to_world;

  gdi_to_world = horizonal_xform
               * plane_to_world
               * plane_translation
               * text_centering_xform
               * gdi_to_plane;

  xform = gdi_to_world;

  return true;
}